

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

void Mvc_CoverSupportAnd(Mvc_Cover_t *pCover,Mvc_Cube_t *pSupp)

{
  uint uVar1;
  uint uVar2;
  Mvc_Cube_t *pMVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = *(uint *)&pSupp->field_0x8;
  uVar7 = uVar1 & 0xffffff;
  bVar4 = (byte)(uVar1 >> 0x18);
  if ((ulong)uVar7 == 1) {
    pSupp->pData[0] = 0xffffffff;
    *(uint *)&pSupp->field_0x14 = 0xffffffff >> (bVar4 & 0x1f);
  }
  else {
    uVar2 = 0xffffffff >> (bVar4 & 0x1f);
    if (uVar7 == 0) {
      pSupp->pData[0] = uVar2;
    }
    else {
      pSupp->pData[uVar7] = uVar2;
      memset(pSupp->pData,0xff,(ulong)(uVar1 * 4 & 0x3fffffc));
    }
  }
  pMVar3 = (pCover->lCubes).pHead;
  if (pMVar3 != (Mvc_Cube_t *)0x0) {
    do {
      if (uVar7 == 0) {
        pSupp->pData[0] = pSupp->pData[0] & pMVar3->pData[0];
      }
      else {
        lVar5 = (ulong)(uVar1 & 0xffffff) + 4;
        if (uVar7 == 1) {
          pSupp->pData[0] = pSupp->pData[0] & pMVar3->pData[0];
          *(uint *)&pSupp->field_0x14 = *(uint *)&pSupp->field_0x14 & *(uint *)&pMVar3->field_0x14;
        }
        else {
          do {
            pSupp->pData[lVar5 + -4] = pSupp->pData[lVar5 + -4] & pMVar3->pData[lVar5 + -4];
            lVar6 = lVar5 + -4;
            bVar8 = lVar5 != 4;
            lVar5 = lVar5 + -1;
          } while (bVar8 && -1 < lVar6);
        }
      }
      pMVar3 = pMVar3->pNext;
    } while (pMVar3 != (Mvc_Cube_t *)0x0);
  }
  return;
}

Assistant:

void Mvc_CoverSupportAnd( Mvc_Cover_t * pCover, Mvc_Cube_t * pSupp )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitFill( pSupp );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitAnd( pSupp, pSupp, pCube );
}